

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long decode_packed_entry_number(codebook *book,oggpack_buffer *b)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int bits;
  
  iVar6 = book->dec_maxlength;
  lVar2 = oggpack_look(b,book->dec_firsttablen);
  if (lVar2 < 0) {
    lVar2 = book->used_entries;
    uVar9 = 0;
  }
  else {
    uVar1 = book->dec_firsttable[lVar2];
    if (-1 < (int)uVar1) {
      iVar6 = (int)book->dec_codelengths[(ulong)uVar1 - 1];
      uVar4 = (ulong)uVar1 - 1;
      goto LAB_001b9fba;
    }
    uVar9 = (ulong)(uVar1 >> 0xf & 0x7fff);
    lVar2 = book->used_entries - (ulong)(uVar1 & 0x7fff);
  }
  do {
    bits = iVar6;
    lVar3 = oggpack_look(b,bits);
    if (-1 < lVar3) break;
    iVar6 = bits + -1;
  } while (1 < bits);
  if (lVar3 < 0) {
    return -1;
  }
  uVar1 = (uint)lVar3;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = (uVar1 & 0xf0f0f0f) << 4 | uVar1 >> 4 & 0xf0f0f0f;
  uVar1 = (uVar1 >> 2 & 0x33333333) + (uVar1 & 0x33333333) * 4;
  for (; 1 < (long)(lVar2 - uVar9); lVar2 = lVar2 - uVar5) {
    uVar4 = lVar2 - uVar9 >> 1;
    if ((uVar1 >> 1 & 0x55555555) + (uVar1 & 0x55555555) * 2 < book->codelist[uVar9 + uVar4]) {
      uVar8 = 0;
      uVar5 = uVar4;
    }
    else {
      uVar5 = 0;
      uVar8 = uVar4;
    }
    uVar9 = uVar9 + uVar8;
  }
  iVar7 = (int)book->dec_codelengths[uVar9];
  iVar6 = iVar7;
  if (bits < iVar7) {
    iVar6 = bits;
  }
  uVar4 = 0xffffffffffffffff;
  if (iVar7 <= bits) {
    uVar4 = uVar9;
  }
LAB_001b9fba:
  oggpack_adv(b,iVar6);
  return uVar4;
}

Assistant:

STIN long decode_packed_entry_number(codebook *book, oggpack_buffer *b){
  int  read=book->dec_maxlength;
  long lo,hi;
  long lok = oggpack_look(b,book->dec_firsttablen);

  if (lok >= 0) {
    long entry = book->dec_firsttable[lok];
    if(entry&0x80000000UL){
      lo=(entry>>15)&0x7fff;
      hi=book->used_entries-(entry&0x7fff);
    }else{
      oggpack_adv(b, book->dec_codelengths[entry-1]);
      return(entry-1);
    }
  }else{
    lo=0;
    hi=book->used_entries;
  }

  /* Single entry codebooks use a firsttablen of 1 and a
     dec_maxlength of 1.  If a single-entry codebook gets here (due to
     failure to read one bit above), the next look attempt will also
     fail and we'll correctly kick out instead of trying to walk the
     underformed tree */

  lok = oggpack_look(b, read);

  while(lok<0 && read>1)
    lok = oggpack_look(b, --read);
  if(lok<0)return -1;

  /* bisect search for the codeword in the ordered list */
  {
    ogg_uint32_t testword=bitreverse((ogg_uint32_t)lok);

    while(hi-lo>1){
      long p=(hi-lo)>>1;
      long test=book->codelist[lo+p]>testword;
      lo+=p&(test-1);
      hi-=p&(-test);
      }

    if(book->dec_codelengths[lo]<=read){
      oggpack_adv(b, book->dec_codelengths[lo]);
      return(lo);
    }
  }

  oggpack_adv(b, read);

  return(-1);
}